

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reorg.cpp
# Opt level: O0

int __thiscall ncnn::Reorg::forward(Reorg *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  long in_RSI;
  long in_RDI;
  int j;
  float *sptr;
  int i;
  float *outptr;
  int p;
  int sw;
  int sh;
  Mat m;
  int q;
  int outc;
  int outh;
  int outw;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  int iVar3;
  Mat *in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  Mat local_f8;
  float *local_b0;
  int local_a4;
  int local_a0;
  int local_9c;
  Mat local_98;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  undefined8 local_40;
  int local_34;
  int local_30;
  int local_2c;
  int local_4;
  
  local_2c = *(int *)(in_RSI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x30);
  local_34 = *(int *)(in_RSI + 0x38);
  local_40 = *(undefined8 *)(in_RSI + 0x10);
  local_44 = local_2c / *(int *)(in_RDI + 0xd0);
  local_48 = local_30 / *(int *)(in_RDI + 0xd0);
  local_4c = local_34 * *(int *)(in_RDI + 0xd0) * *(int *)(in_RDI + 0xd0);
  ncnn::Mat::create(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,
                    (int)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffed8,
                    (Allocator *)in_stack_fffffffffffffed0);
  bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffed0);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    for (local_50 = 0; local_50 < local_34; local_50 = local_50 + 1) {
      ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                         (int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
      for (local_9c = 0; local_9c < *(int *)(in_RDI + 0xd0); local_9c = local_9c + 1) {
        for (local_a0 = 0; local_a0 < *(int *)(in_RDI + 0xd0); local_a0 = local_a0 + 1) {
          if (*(int *)(in_RDI + 0xd4) == 0) {
            local_a4 = local_50 * *(int *)(in_RDI + 0xd0) * *(int *)(in_RDI + 0xd0) +
                       local_9c * *(int *)(in_RDI + 0xd0) + local_a0;
          }
          else {
            local_a4 = (local_9c * *(int *)(in_RDI + 0xd0) + local_a0) * local_34 + local_50;
          }
          ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                             (int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
          pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_f8);
          ncnn::Mat::~Mat((Mat *)0x6bcadc);
          local_b0 = pfVar2;
          for (in_stack_fffffffffffffef8 = 0; in_stack_fffffffffffffef8 < local_48;
              in_stack_fffffffffffffef8 = in_stack_fffffffffffffef8 + 1) {
            pfVar2 = ncnn::Mat::row(&local_98,
                                    in_stack_fffffffffffffef8 * *(int *)(in_RDI + 0xd0) + local_9c);
            in_stack_fffffffffffffef0 = (Mat *)(pfVar2 + local_a0);
            for (iVar3 = 0; iVar3 < local_44; iVar3 = iVar3 + 1) {
              *local_b0 = *(float *)&in_stack_fffffffffffffef0->data;
              in_stack_fffffffffffffef0 =
                   (Mat *)((long)&in_stack_fffffffffffffef0->data +
                          (long)*(int *)(in_RDI + 0xd0) * 4);
              local_b0 = local_b0 + 1;
            }
          }
        }
      }
      ncnn::Mat::~Mat((Mat *)0x6bcc2d);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Reorg::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w / stride;
    int outh = h / stride;
    int outc = channels * stride * stride;

    top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const Mat m = bottom_blob.channel(q);

        for (int sh = 0; sh < stride; sh++)
        {
            for (int sw = 0; sw < stride; sw++)
            {
                int p;
                if (mode == 0)
                    p = q * stride * stride + sh * stride + sw;
                else // if (mode == 1)
                    p = (sh * stride + sw) * channels + q;

                float* outptr = top_blob.channel(p);

                for (int i = 0; i < outh; i++)
                {
                    const float* sptr = m.row(i * stride + sh) + sw;
                    for (int j = 0; j < outw; j++)
                    {
                        outptr[0] = sptr[0];

                        sptr += stride;
                        outptr++;
                    }
                }
            }
        }
    }

    return 0;
}